

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::~ArrayBuilder
          (ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *this)

{
  Embargo *pEVar1;
  RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *pRVar2;
  Embargo *pEVar3;
  
  pEVar1 = this->ptr;
  if (pEVar1 != (Embargo *)0x0) {
    pRVar2 = this->pos;
    pEVar3 = this->endPtr;
    this->ptr = (Embargo *)0x0;
    this->pos = (RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *)0x0;
    this->endPtr = (Embargo *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pEVar1,0x10,(long)pRVar2 - (long)pEVar1 >> 4,
               (long)pEVar3 - (long)pEVar1 >> 4,
               ArrayDisposer::Dispose_<capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }